

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop.c
# Opt level: O0

void read_stop(stop_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  location_type_t lVar2;
  wheelchair_boarding_t wVar3;
  double dVar4;
  int local_2c;
  int i;
  char **field_values_local;
  char **field_names_local;
  int field_count_local;
  stop_t *record_local;
  
  init_stop(record);
  for (local_2c = 0; local_2c < field_count; local_2c = local_2c + 1) {
    iVar1 = strcmp(field_names[local_2c],"stop_id");
    if (iVar1 == 0) {
      strcpy(record->id,field_values[local_2c]);
    }
    else {
      iVar1 = strcmp(field_names[local_2c],"stop_code");
      if (iVar1 == 0) {
        strcpy(record->code,field_values[local_2c]);
      }
      else {
        iVar1 = strcmp(field_names[local_2c],"stop_name");
        if (iVar1 == 0) {
          strcpy(record->name,field_values[local_2c]);
        }
        else {
          iVar1 = strcmp(field_names[local_2c],"stop_desc");
          if (iVar1 == 0) {
            strcpy(record->desc,field_values[local_2c]);
          }
          else {
            iVar1 = strcmp(field_names[local_2c],"stop_lat");
            if (iVar1 == 0) {
              dVar4 = strtod(field_values[local_2c],(char **)0x0);
              record->lat = (longdouble)dVar4;
            }
            else {
              iVar1 = strcmp(field_names[local_2c],"stop_lon");
              if (iVar1 == 0) {
                dVar4 = strtod(field_values[local_2c],(char **)0x0);
                record->lon = (longdouble)dVar4;
              }
              else {
                iVar1 = strcmp(field_names[local_2c],"zone_id");
                if (iVar1 == 0) {
                  strcpy(record->zone_id,field_values[local_2c]);
                }
                else {
                  iVar1 = strcmp(field_names[local_2c],"stop_url");
                  if (iVar1 == 0) {
                    strcpy(record->url,field_values[local_2c]);
                  }
                  else {
                    iVar1 = strcmp(field_names[local_2c],"location_type");
                    if (iVar1 == 0) {
                      lVar2 = parse_location_type(field_values[local_2c]);
                      record->location_type = lVar2;
                    }
                    else {
                      iVar1 = strcmp(field_names[local_2c],"parent_station");
                      if (iVar1 == 0) {
                        strcpy(record->parent_station,field_values[local_2c]);
                      }
                      else {
                        iVar1 = strcmp(field_names[local_2c],"stop_timezone");
                        if (iVar1 == 0) {
                          strcpy(record->timezone,field_values[local_2c]);
                        }
                        else {
                          iVar1 = strcmp(field_names[local_2c],"wheelchair_boarding");
                          if (iVar1 == 0) {
                            wVar3 = parse_wheelchair_boarding(field_values[local_2c]);
                            record->wheelchair_boarding = wVar3;
                          }
                          else {
                            iVar1 = strcmp(field_names[local_2c],"level_id");
                            if (iVar1 == 0) {
                              strcpy(record->level_id,field_values[local_2c]);
                            }
                            else {
                              iVar1 = strcmp(field_names[local_2c],"platform_code");
                              if (iVar1 == 0) {
                                strcpy(record->platform_code,field_values[local_2c]);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void read_stop(stop_t *record, int field_count, const char **field_names, const char **field_values) {
    init_stop(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "stop_id") == 0) {
            strcpy(record->id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "stop_code") == 0) {
            strcpy(record->code, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "stop_name") == 0) {
            strcpy(record->name, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "stop_desc") == 0) {
            strcpy(record->desc, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "stop_lat") == 0) {
            record->lat = strtod(field_values[i], NULL);  // TODO: same as shape.c:26
            continue;
        }
        if (strcmp(field_names[i], "stop_lon") == 0) {
            record->lon = strtod(field_values[i], NULL);  // TODO: same as shape.c:26
            continue;
        }
        if (strcmp(field_names[i], "zone_id") == 0) {
            strcpy(record->zone_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "stop_url") == 0) {
            strcpy(record->url, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "location_type") == 0) {
            record->location_type = parse_location_type(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "parent_station") == 0) {
            strcpy(record->parent_station, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "stop_timezone") == 0) {
            strcpy(record->timezone, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "wheelchair_boarding") == 0) {
            record->wheelchair_boarding = parse_wheelchair_boarding(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "level_id") == 0) {
            strcpy(record->level_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "platform_code") == 0) {
            strcpy(record->platform_code, field_values[i]);
            continue;
        }
    }
}